

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS ref_phys_minspac(REF_DBL reynolds_number,REF_DBL *yplus1)

{
  undefined8 uVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  *yplus1 = -1.0;
  dVar3 = reynolds_number * 0.06;
  if (dVar3 <= 0.0) {
    pcVar2 = "expected positive reynolds_number";
    uVar1 = 0x561;
  }
  else {
    dVar4 = log(dVar3);
    dVar7 = log(dVar3);
    if (dVar7 * dVar7 * *(double *)(&DAT_0021a560 + (ulong)(0.0 < dVar4 * dVar4 * 1e+20) * 8) <=
        0.445) {
      pcVar2 = "can not invert for cf";
      uVar1 = 0x563;
    }
    else {
      dVar3 = log(dVar3);
      dVar4 = 0.455 / (dVar3 * dVar3);
      dVar3 = dVar4 * 1e+20;
      if (dVar3 <= -dVar3) {
        dVar3 = -dVar3;
      }
      if (dVar3 <= 2.0) {
        pcVar2 = "can not invert cf";
        uVar1 = 0x565;
      }
      else {
        dVar5 = reynolds_number * 1e+20;
        dVar3 = (double)((ulong)DAT_00212e40 ^ (ulong)dVar5);
        dVar4 = 2.0 / dVar4;
        dVar6 = SQRT(dVar4);
        dVar7 = dVar6;
        if (dVar4 < 0.0) {
          dVar7 = sqrt(dVar4);
        }
        if (dVar5 <= dVar3) {
          dVar5 = dVar3;
        }
        if (dVar4 < 0.0) {
          dVar6 = sqrt(dVar4);
        }
        if ((double)(~-(ulong)(0.0 < dVar7) & (ulong)-dVar6 | (ulong)dVar6 & -(ulong)(0.0 < dVar7))
            < dVar5) {
          if (dVar4 < 0.0) {
            dVar4 = sqrt(dVar4);
          }
          else {
            dVar4 = SQRT(dVar4);
          }
          *yplus1 = dVar4 / reynolds_number;
          return 0;
        }
        pcVar2 = "can not invert reynolds_number for yplus1";
        uVar1 = 0x567;
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar1,
         "ref_phys_minspac",pcVar2);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_phys_minspac(REF_DBL reynolds_number, REF_DBL *yplus1) {
  REF_DBL cf;
  *yplus1 = -1.0;
  /* laminar: 1.0 / ( sqrt(reynolds_number) *20.0 ); */
  RAS(0.06 * reynolds_number > 0, "expected positive reynolds_number");
  RAS(ref_math_divisible(0.445, pow(log(0.06 * reynolds_number), 2)),
      "can not invert for cf");
  cf = 0.455 / pow(log(0.06 * reynolds_number), 2);
  RAS(ref_math_divisible(2.0, cf), "can not invert cf");
  RAS(ref_math_divisible(sqrt(2.0 / cf), reynolds_number),
      "can not invert reynolds_number for yplus1");

  *yplus1 = sqrt(2.0 / cf) / reynolds_number;
  return REF_SUCCESS;
}